

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O2

void printMapping(UCMapping *m,UChar32 *codePoints,uint8_t *bytes,FILE *f)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 < m->uLen; lVar1 = lVar1 + 1) {
    fprintf((FILE *)f,"<U%04lX>",(long)codePoints[lVar1]);
  }
  fputc(0x20,(FILE *)f);
  for (lVar1 = 0; lVar1 < m->bLen; lVar1 = lVar1 + 1) {
    fprintf((FILE *)f,"\\x%02X",(ulong)bytes[lVar1]);
  }
  if (-1 < m->f) {
    fprintf((FILE *)f," |%u\n");
    return;
  }
  fputs("\n",(FILE *)f);
  return;
}

Assistant:

static void
printMapping(UCMapping *m, UChar32 *codePoints, uint8_t *bytes, FILE *f) {
    int32_t j;

    for(j=0; j<m->uLen; ++j) {
        fprintf(f, "<U%04lX>", (long)codePoints[j]);
    }

    fputc(' ', f);

    for(j=0; j<m->bLen; ++j) {
        fprintf(f, "\\x%02X", bytes[j]);
    }

    if(m->f>=0) {
        fprintf(f, " |%u\n", m->f);
    } else {
        fputs("\n", f);
    }
}